

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::TiledInputFile::Data::initialize(Data *this)

{
  exr_storage_t eVar1;
  int iVar2;
  ArgExc *this_00;
  
  eVar1 = Context::storage(this->_ctxt,this->partNumber);
  if (eVar1 == EXR_STORAGE_TILED) {
    iVar2 = exr_get_tile_descriptor
                      (*(this->_ctxt->_ctxt).
                        super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       ,this->partNumber,&this->tile_x_size,&this->tile_y_size,
                       &this->tile_level_mode,&this->tile_round_mode);
    if (iVar2 == 0) {
      iVar2 = exr_get_tile_levels(*(this->_ctxt->_ctxt).
                                   super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,this->partNumber,&this->num_x_levels,&this->num_y_levels)
      ;
      if (iVar2 == 0) {
        return;
      }
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query number of tile levels");
    }
    else {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,"Unable to query tile descriptor");
    }
  }
  else {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"File part is not a tiled part");
  }
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void initialize ()
    {
        if (_ctxt->storage (partNumber) != EXR_STORAGE_TILED)
            throw IEX_NAMESPACE::ArgExc ("File part is not a tiled part");

        if (EXR_ERR_SUCCESS != exr_get_tile_descriptor (
                *_ctxt,
                partNumber,
                &tile_x_size,
                &tile_y_size,
                &tile_level_mode,
                &tile_round_mode))
            throw IEX_NAMESPACE::ArgExc ("Unable to query tile descriptor");

        if (EXR_ERR_SUCCESS != exr_get_tile_levels (
                *_ctxt,
                partNumber,
                &num_x_levels,
                &num_y_levels))
            throw IEX_NAMESPACE::ArgExc ("Unable to query number of tile levels");
    }